

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall
GdlRule::DebugXml(GdlRule *this,GrcManager *pcman,ofstream *strmOut,string *staPathToCur,
                 int nPassNum,int nRuleNum)

{
  pointer ppGVar1;
  GdlExpression *pGVar2;
  GdlRuleItem *pGVar3;
  bool bVar4;
  ostream *poVar5;
  long lVar6;
  pointer ppGVar7;
  ulong uVar8;
  size_t irit;
  bool bVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  GrpLineAndFile lnf;
  string local_f0;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70;
  string local_50;
  
  poVar5 = std::operator<<((ostream *)strmOut,"      <rule id=\"");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,nPassNum);
  poVar5 = std::operator<<(poVar5,".");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,nRuleNum);
  poVar5 = std::operator<<(poVar5,"\" inFile=\"");
  std::__cxx11::string::string((string *)&local_f0,(string *)staPathToCur);
  GrpLineAndFile::FileWithPath((string *)&lnf,(GrpLineAndFile *)this,&local_f0);
  poVar5 = std::operator<<(poVar5,(string *)&lnf);
  poVar5 = std::operator<<(poVar5,"\" atLine=\"");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(this->super_GdlObject).m_lnf.m_nLineOrig);
  poVar5 = std::operator<<(poVar5,"\" preAnys=\"");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::operator<<(poVar5,"\"\n            prettyPrint=\"");
  std::__cxx11::string::~string((string *)&lnf);
  std::__cxx11::string::~string((string *)&local_f0);
  RulePrettyPrint(this,pcman,(ostream *)strmOut,true);
  std::operator<<((ostream *)strmOut,"\" >\n");
  if ((this->m_vpexpConstraints).
      super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->m_vpexpConstraints).
      super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::operator<<((ostream *)strmOut,"        <ruleConstraints>\n");
    for (uVar10 = 0;
        ppGVar1 = (this->m_vpexpConstraints).
                  super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
        uVar10 < (ulong)((long)(this->m_vpexpConstraints).
                               super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar1 >> 3);
        uVar10 = uVar10 + 1) {
      GrpLineAndFile::GrpLineAndFile(&lnf,&(ppGVar1[uVar10]->super_GdlObject).m_lnf);
      std::operator<<((ostream *)strmOut,"          <ruleConstraint gdl=\"{ ");
      pGVar2 = (this->m_vpexpConstraints).
               super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar10];
      (*pGVar2->_vptr_GdlExpression[0x1d])(pGVar2,pcman,strmOut,1,0);
      poVar5 = std::operator<<((ostream *)strmOut," }\" inFile=\"");
      std::__cxx11::string::string((string *)&local_70,(string *)staPathToCur);
      GrpLineAndFile::FileWithPath(&local_50,&lnf,&local_70);
      poVar5 = std::operator<<(poVar5,(string *)&local_50);
      poVar5 = std::operator<<(poVar5,"\" atLine=\"");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,lnf.m_nLineOrig);
      std::operator<<(poVar5,"\" />\n");
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&lnf.m_staFile);
    }
    std::operator<<((ostream *)strmOut,"        </ruleConstraints>\n");
  }
  bVar12 = this->m_nScanAdvance != -1;
  ppGVar7 = (this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar8 = (ulong)((long)(this->m_vprit).
                        super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)ppGVar7) >> 3;
  uVar11 = 0;
  uVar10 = uVar8 & 0xffffffff;
  if ((int)uVar8 < 1) {
    uVar10 = uVar11;
  }
  bVar9 = false;
  for (; uVar10 != uVar11; uVar11 = uVar11 + 1) {
    pGVar3 = ppGVar7[uVar11];
    bVar4 = true;
    if (pGVar3 != (GdlRuleItem *)0x0) {
      lVar6 = __dynamic_cast(pGVar3,&GdlRuleItem::typeinfo,&GdlSubstitutionItem::typeinfo,0);
      bVar9 = (bool)(lVar6 != 0 | bVar9);
      lVar6 = __dynamic_cast(pGVar3,&GdlRuleItem::typeinfo,&GdlSetAttrItem::typeinfo,0);
      if (lVar6 != 0) {
        bVar4 = (bool)(pGVar3->m_pexpConstraint != (GdlExpression *)0x0 | bVar12);
      }
    }
    bVar12 = bVar4;
  }
  if (bVar9) {
    std::operator<<((ostream *)strmOut,"        <lhs>\n");
    for (uVar10 = 0;
        ppGVar7 = (this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        uVar10 < (ulong)((long)(this->m_vprit).
                               super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)ppGVar7 >> 3);
        uVar10 = uVar10 + 1) {
      pGVar3 = ppGVar7[uVar10];
      std::__cxx11::string::string(local_90,(string *)staPathToCur);
      (*pGVar3->_vptr_GdlRuleItem[0x22])(pGVar3,pcman,strmOut,local_90);
      std::__cxx11::string::~string(local_90);
    }
    std::operator<<((ostream *)strmOut,"        </lhs>\n");
  }
  std::operator<<((ostream *)strmOut,"        <rhs>\n");
  for (uVar10 = 0;
      ppGVar7 = (this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar10 < (ulong)((long)(this->m_vprit).
                             super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppGVar7 >> 3);
      uVar10 = uVar10 + 1) {
    pGVar3 = ppGVar7[uVar10];
    std::__cxx11::string::string(local_b0,(string *)staPathToCur);
    (*pGVar3->_vptr_GdlRuleItem[0x23])(pGVar3,pcman,strmOut,local_b0);
    std::__cxx11::string::~string(local_b0);
  }
  std::operator<<((ostream *)strmOut,"        </rhs>\n");
  if (bVar12) {
    std::operator<<((ostream *)strmOut,"        <context>\n");
    lnf.m_nLinePre = 0;
    for (uVar10 = 0;
        ppGVar7 = (this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        uVar10 < (ulong)((long)(this->m_vprit).
                               super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)ppGVar7 >> 3);
        uVar10 = uVar10 + 1) {
      if ((int)uVar10 == this->m_nScanAdvance) {
        std::operator<<((ostream *)strmOut,"          <caret />\n");
        ppGVar7 = (this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      }
      pGVar3 = ppGVar7[uVar10];
      std::__cxx11::string::string(local_d0,(string *)staPathToCur);
      (*pGVar3->_vptr_GdlRuleItem[0x24])(pGVar3,pcman,strmOut,local_d0,&lnf);
      std::__cxx11::string::~string(local_d0);
    }
    std::operator<<((ostream *)strmOut,"        </context>\n");
  }
  std::operator<<((ostream *)strmOut,"      </rule>\n");
  return;
}

Assistant:

void GdlRule::DebugXml(GrcManager * pcman, std::ofstream & strmOut, std::string staPathToCur,
	int nPassNum, int nRuleNum)
{
	strmOut << "      <rule id=\"" << nPassNum << "." << nRuleNum
		<< "\" inFile=\"" << LineAndFile().FileWithPath(staPathToCur)
		<< "\" atLine=\"" << LineAndFile().OriginalLine()
		<< "\" preAnys=\"" << m_critPrependedAnys
		<< "\"\n            prettyPrint=\"";
	this->RulePrettyPrint(pcman, strmOut, true);
	strmOut << "\" >\n";

	if (m_vpexpConstraints.size() > 0)
	{
		strmOut << "        <ruleConstraints>\n";
		for (size_t iexp = 0; iexp < m_vpexpConstraints.size(); iexp++)
		{
			GrpLineAndFile lnf = m_vpexpConstraints[iexp]->LineAndFile();
			strmOut << "          <ruleConstraint gdl=\"{ ";
			m_vpexpConstraints[iexp]->PrettyPrint(pcman, strmOut, true);
			strmOut << " }\" inFile=\"" << lnf.FileWithPath(staPathToCur)
				<< "\" atLine=\"" << lnf.OriginalLine() << "\" />\n";
		}
		strmOut << "        </ruleConstraints>\n";
	}

	//	Loop through all the items to see if we need a LHS or a context.
	bool fLhs = false;
	bool fContext = (m_nScanAdvance != -1);
	int irit;
	for (irit = 0; irit < signed(m_vprit.size()) ; irit++)
	{
		GdlRuleItem * prit = m_vprit[irit];
		GdlSubstitutionItem * pritsub = dynamic_cast<GdlSubstitutionItem *>(prit);
		if (pritsub)
			fLhs = true;

		GdlSetAttrItem * pritset = dynamic_cast<GdlSetAttrItem *>(prit);
		if (!pritset)
			fContext = true;
		else if (prit->m_pexpConstraint)
			fContext = true;
	}

	// LHS
	if (fLhs)
	{
		strmOut << "        <lhs>\n";
		for (size_t irit = 0; irit < m_vprit.size(); irit++)
		{
			m_vprit[irit]->DebugXmlLhs(pcman, strmOut, staPathToCur);
		}
		strmOut << "        </lhs>\n";
	}

	// RHS
	strmOut << "        <rhs>\n";
	for (size_t irit = 0; irit < m_vprit.size(); irit++)
	{
		m_vprit[irit]->DebugXmlRhs(pcman, strmOut, staPathToCur);
	}
	strmOut << "        </rhs>\n";

	// Context
	if (fContext)
	{
		strmOut << "        <context>\n";
		int iritRhs = 0;
		for (size_t irit = 0; irit < m_vprit.size(); irit++)
		{
			if (m_nScanAdvance == (signed)irit)
				strmOut << "          <caret />\n";

			m_vprit[irit]->DebugXmlContext(pcman, strmOut, staPathToCur, iritRhs);
		}
		strmOut << "        </context>\n";
	}

	strmOut << "      </rule>\n";
}